

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QDnsMailExchangeRecord>::Inserter::~Inserter(Inserter *this)

{
  qsizetype *pqVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = this->nInserts;
  if (this->displaceFrom != this->displaceTo) {
    memmove(this->displaceFrom,this->displaceTo,this->bytes);
    lVar2 = (long)this->displaceFrom - (long)this->displaceTo >> 3;
    lVar3 = -lVar2;
    if (lVar2 < 1) {
      lVar3 = lVar2;
    }
    lVar4 = lVar4 + lVar3;
  }
  pqVar1 = &this->data->size;
  *pqVar1 = *pqVar1 + lVar4;
  return;
}

Assistant:

~Inserter() {
            auto inserts = nInserts;
            if constexpr (!std::is_nothrow_copy_constructible_v<T>) {
                if (displaceFrom != displaceTo) {
                    ::memmove(static_cast<void *>(displaceFrom), static_cast<void *>(displaceTo), bytes);
                    inserts -= qAbs(displaceFrom - displaceTo);
                }
            }
            data->size += inserts;
        }